

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O0

vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> * __thiscall
HBF::reconstruct_path
          (vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *__return_storage_ptr__,HBF *this,
          vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
          *came_from,vector<double,_std::allocator<double>_> *start,maze_s final)

{
  bool bVar1;
  initializer_list<HBF::maze_s> __l;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  double local_b0;
  double y;
  double x;
  maze_s current;
  int stack;
  allocator<HBF::maze_s> local_69;
  maze_s local_68;
  iterator local_40;
  size_type local_38;
  undefined1 local_29;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *start_local;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  *came_from_local;
  HBF *this_local;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *path;
  
  local_29 = 0;
  local_68.y = final.y;
  local_68.theta = final.theta;
  local_68.g = final.g;
  local_68.x = final.x;
  local_40 = &local_68;
  local_38 = 1;
  local_28 = start;
  start_local = (vector<double,_std::allocator<double>_> *)came_from;
  came_from_local =
       (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        *)this;
  this_local = (HBF *)__return_storage_ptr__;
  std::allocator<HBF::maze_s>::allocator(&local_69);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (__return_storage_ptr__,__l,&local_69);
  std::allocator<HBF::maze_s>::~allocator(&local_69);
  current.theta._0_4_ = theta_to_stack_number(this,final.theta);
  pvVar3 = std::
           vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
           ::operator[](came_from,(long)current.theta._0_4_);
  iVar2 = idx(this,final.x);
  pvVar4 = std::
           vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
           ::operator[](pvVar3,(long)iVar2);
  iVar2 = idx(this,final.y);
  pvVar5 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[](pvVar4,(long)iVar2);
  x = pvVar5->g;
  current.g = pvVar5->x;
  current.x = pvVar5->y;
  current.y = pvVar5->theta;
  current.theta._0_4_ = theta_to_stack_number(this,current.y);
  y = current.g;
  local_b0 = current.x;
  while( true ) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](start,0);
    bVar1 = false;
    if ((y != *pvVar6) || (NAN(y) || NAN(*pvVar6))) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](start,1);
      bVar1 = local_b0 != *pvVar6;
    }
    if (!bVar1) break;
    std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::push_back
              (__return_storage_ptr__,(value_type *)&x);
    pvVar3 = std::
             vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
             ::operator[](came_from,(long)current.theta._0_4_);
    iVar2 = idx(this,y);
    pvVar4 = std::
             vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
             ::operator[](pvVar3,(long)iVar2);
    iVar2 = idx(this,local_b0);
    pvVar5 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[](pvVar4,(long)iVar2);
    x = pvVar5->g;
    y = pvVar5->x;
    local_b0 = pvVar5->y;
    current.y = pvVar5->theta;
    current.g = y;
    current.x = local_b0;
    current.theta._0_4_ = theta_to_stack_number(this,current.y);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<HBF::maze_s>
HBF::reconstruct_path(vector<vector<vector<HBF::maze_s> > > came_from, vector<double> start, HBF::maze_s final) {

    vector<maze_s> path = {final};

    int stack = theta_to_stack_number(final.theta);

    maze_s current = came_from[stack][idx(final.x)][idx(final.y)];

    stack = theta_to_stack_number(current.theta);

    double x = current.x;
    double y = current.y;
    while (x != start[0] && y != start[1]) {
        path.push_back(current);
        current = came_from[stack][idx(x)][idx(y)];
        x = current.x;
        y = current.y;
        stack = theta_to_stack_number(current.theta);
    }

    return path;

}